

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

double polymul_internal::polynomial_evaluator<double,_double,_2,_2>::eval(double *p,double *x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double *x_local;
  double *p_local;
  
  iVar1 = binomial(3,1);
  dVar2 = eval_monomial(p + iVar1,x);
  dVar3 = polynomial_evaluator<double,_double,_2,_1>::eval(p,x);
  return dVar2 + dVar3;
}

Assistant:

static vartype eval(const numtype p[], const vartype x[]) {
    return polynomial_evaluator<numtype, vartype, Nvar, Ndeg>::eval_monomial(
               p + binomial(Nvar + Ndeg - 1, Ndeg - 1), x) +
           polynomial_evaluator<numtype, vartype, Nvar, Ndeg - 1>::eval(p, x);
  }